

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_c.c
# Opt level: O2

int from_octal(char *p,size_t l)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  for (sVar2 = 0; l != sVar2; sVar2 = sVar2 + 1) {
    iVar1 = (int)p[sVar2] + iVar1 * 8 + -0x30;
  }
  return iVar1;
}

Assistant:

static int
from_octal(const char *p, size_t l)
{
	int r = 0;

	while (l > 0) {
		r *= 8;
		r += *p - '0';
		--l;
		++p;
	}
	return (r);
}